

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# turbocompression.h
# Opt level: O2

uint8_t * turbouncompress(uint8_t *in,uint32_t *out,uint32_t *nvalue)

{
  uint32_t uVar1;
  uint uVar2;
  uint uVar3;
  uint8_t *puVar4;
  uint32_t k;
  ulong uVar5;
  uint32_t *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint32_t uVar9;
  uint32_t *output;
  uint8_t *input;
  uint32_t *local_40;
  uint8_t *local_38;
  
  uVar9 = *(uint32_t *)in;
  *nvalue = uVar9;
  if (uVar9 == 0) {
    puVar4 = in + 4;
  }
  else {
    uVar1 = *(uint32_t *)(in + 4);
    uVar3 = *(uint32_t *)(in + 8) - uVar1;
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    uVar8 = 0;
    uVar7 = (ulong)((uVar2 ^ 0xffffffe0) + 0x21);
    if (*(uint32_t *)(in + 8) == uVar1) {
      uVar7 = uVar8;
    }
    puVar6 = out;
    for (uVar5 = 0; uVar5 < uVar9 >> 5; uVar5 = uVar5 + 1) {
      local_38 = in + (uVar8 >> 3) + 0xc;
      local_40 = puVar6;
      (*funcForUnpackArr[uVar7])(uVar1,&local_38,&local_40);
      uVar9 = *nvalue;
      puVar6 = puVar6 + 0x20;
      uVar8 = (ulong)(uint)((int)uVar8 + (int)uVar7 * 0x20);
    }
    uVar8 = (ulong)((uVar9 & 0x1f) << 2);
    memcpy(out + (uVar9 & 0xffffffe0),in + (ulong)((int)uVar7 * (uVar9 >> 5) * 4) + 0xc,uVar8);
    puVar4 = in + (ulong)((int)uVar7 * (uVar9 >> 5) * 4) + 0xc + uVar8;
  }
  return puVar4;
}

Assistant:

inline const uint8_t *turbouncompress(const uint8_t *in, uint32_t *out,
                                      uint32_t &nvalue) {
  memcpy(&nvalue, in, sizeof(nvalue));
  in += sizeof(nvalue);
  if (nvalue == 0)
    return in;
  uint32_t m, M;
  memcpy(&m, in, sizeof(m));
  in += sizeof(m);
  memcpy(&M, in, sizeof(M));
  in += sizeof(M);
  int b = bits(static_cast<uint32_t>(M - m));
#ifdef _OPENMP
#pragma omp parallel for
#endif
  for (uint32_t k = 0; k < nvalue / 32; ++k) {
    // could code as funcForUnpackArr[b](m,&in,&out); but it hurts
    // parallelization
    const uint8_t *input = in + 32 * b * k / 8;
    uint32_t *output = out + k * 32;
    funcForUnpackArr[b](m, &input, &output);
  }
  in = in + (32 * b / 8) * (nvalue / 32);
  out = out + 32 * (nvalue / 32);

  // we could pack the rest, but we don't  bother
  uint32_t leftover = nvalue - nvalue / 32 * 32;
  memcpy(out, in, leftover * sizeof(uint32_t));
  in += leftover * sizeof(uint32_t);
  return in;
}